

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Int16Type.cpp
# Opt level: O0

void __thiscall hdc::Int16Type::Int16Type(Int16Type *this,Token *token)

{
  Token *token_local;
  Int16Type *this_local;
  
  PrimitiveType::PrimitiveType(&this->super_PrimitiveType);
  (this->super_PrimitiveType).super_Type.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_00220518;
  Token::Token(&this->token);
  Token::operator=(&this->token,token);
  (this->super_PrimitiveType).super_Type.super_ASTNode.kind = AST_INT16_TYPE;
  return;
}

Assistant:

Int16Type::Int16Type(Token& token) {
    this->token = token;
    this->kind = AST_INT16_TYPE;
}